

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O1

TAttributes * __thiscall
glslang::TParseContext::makeAttributes(TParseContext *this,TString *identifier,TIntermNode *node)

{
  _List_node_header *p_Var1;
  size_t *psVar2;
  TAttributeType TVar3;
  TPoolAllocator *pTVar4;
  TAttributes *pTVar5;
  TIntermAggregate *pTVar6;
  _List_node_base *p_Var7;
  _Node_alloc_type *__alloc;
  TParseContext *this_00;
  
  pTVar4 = GetThreadPoolAllocator();
  pTVar5 = (TAttributes *)TPoolAllocator::allocate(pTVar4,0x20);
  pTVar4 = GetThreadPoolAllocator();
  (pTVar5->super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl.super__Node_alloc_type.allocator = pTVar4;
  p_Var1 = &(pTVar5->
            super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
            super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
            ._M_impl._M_node;
  (pTVar5->super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node.super__List_node_base._M_prev = &p_Var1->super__List_node_base;
  (pTVar5->super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node.super__List_node_base._M_next = &p_Var1->super__List_node_base;
  (pTVar5->super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node._M_size = 0;
  this_00 = (TParseContext *)(this->super_TParseContextBase).super_TParseVersions.intermediate;
  pTVar6 = TIntermediate::makeAggregate((TIntermediate *)this_00,node);
  TVar3 = attributeFromName(this_00,identifier);
  p_Var7 = (_List_node_base *)
           TPoolAllocator::allocate
                     ((pTVar5->
                      super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                      ).
                      super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                      ._M_impl.super__Node_alloc_type.allocator,0x20);
  *(TAttributeType *)&p_Var7[1]._M_next = TVar3;
  p_Var7[1]._M_prev = (_List_node_base *)pTVar6;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar2 = &(pTVar5->
            super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
            super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
            ._M_impl._M_node._M_size;
  *psVar2 = *psVar2 + 1;
  return pTVar5;
}

Assistant:

TAttributes* TParseContext::makeAttributes(const TString& identifier, TIntermNode* node) const
{
    TAttributes *attributes = nullptr;
    attributes = NewPoolObject(attributes);

    // for now, node is always a simple single expression, but other code expects
    // a list, so make it so
    TIntermAggregate* agg = intermediate.makeAggregate(node);
    TAttributeArgs args = { attributeFromName(identifier), agg };
    attributes->push_back(args);
    return attributes;
}